

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lputil.c
# Opt level: O0

_Bool ValidateMagic(uint8_t *region,uint8_t *expected_magic,size_t magic_len)

{
  int local_34;
  byte *pbStack_30;
  int i;
  uint8_t *regionptr;
  size_t magic_len_local;
  uint8_t *expected_magic_local;
  uint8_t *region_local;
  
  local_34 = 0;
  pbStack_30 = region;
  while( true ) {
    if (magic_len <= (ulong)(long)local_34) {
      return true;
    }
    if (*pbStack_30 != expected_magic[local_34]) break;
    pbStack_30 = pbStack_30 + 1;
    local_34 = local_34 + 1;
  }
  LPDebug("","(%s) %d != %d","ValidateMagic",(ulong)*pbStack_30,(ulong)expected_magic[local_34]);
  return false;
}

Assistant:

bool
ValidateMagic(uint8_t *region, const uint8_t *expected_magic, const size_t magic_len)
{
	uint8_t *regionptr = region;

	for (int i = 0; i < magic_len; i++) {
		if (*regionptr == expected_magic[i]) {
			regionptr++;
		} else {
			LPDebug("", "(%s) %d != %d", __func__, *regionptr, expected_magic[i]);
			return false;
		}
	}

	return true;
}